

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

void reset_group_sequentialProps(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  if (args_info->sequentialProps_group_counter != 0) {
    args_info->com_given = 0;
    args_info->comvel_given = 0;
    args_info->deltaCount_given = 0;
    args_info->fluxOut_given = 0;
    args_info->ca1_given = 0;
    args_info->ca2_given = 0;
    args_info->gcn_given = 0;
    args_info->testequi_given = 0;
    args_info->sequentialProps_group_counter = 0;
  }
  return;
}

Assistant:

static void
reset_group_sequentialProps(struct gengetopt_args_info *args_info)
{
  if (! args_info->sequentialProps_group_counter)
    return;
  
  args_info->com_given = 0 ;
  args_info->comvel_given = 0 ;
  args_info->deltaCount_given = 0 ;
  args_info->fluxOut_given = 0 ;
  args_info->ca1_given = 0 ;
  args_info->ca2_given = 0 ;
  args_info->gcn_given = 0 ;
  args_info->testequi_given = 0 ;

  args_info->sequentialProps_group_counter = 0;
}